

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding_test.cc
# Opt level: O0

void __thiscall
leveldb::Coding_Varint32Truncation_Test::~Coding_Varint32Truncation_Test
          (Coding_Varint32Truncation_Test *this)

{
  Coding_Varint32Truncation_Test *this_local;
  
  ~Coding_Varint32Truncation_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Coding, Varint32Truncation) {
  uint32_t large_value = (1u << 31) + 100;
  std::string s;
  PutVarint32(&s, large_value);
  uint32_t result;
  for (size_t len = 0; len < s.size() - 1; len++) {
    ASSERT_TRUE(GetVarint32Ptr(s.data(), s.data() + len, &result) == nullptr);
  }
  ASSERT_TRUE(GetVarint32Ptr(s.data(), s.data() + s.size(), &result) !=
              nullptr);
  ASSERT_EQ(large_value, result);
}